

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

bool __thiscall Reducer::tryToReplaceCurrent(Reducer *this,Expression *with)

{
  bool bVar1;
  ostream *poVar2;
  string local_48;
  Expression *local_28;
  Expression *curr;
  Expression *with_local;
  Reducer *this_local;
  
  curr = with;
  with_local = (Expression *)this;
  bVar1 = isOkReplacement(this,with);
  if (bVar1) {
    local_28 = wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::getCurrent
                         (&(this->
                           super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                           ).
                           super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>
                           .super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>);
    bVar1 = wasm::Type::operator!=(&local_28->type,&curr->type);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = shouldTryToReduce(this,1);
      if (bVar1) {
        wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::replaceCurrent
                  (&(this->
                    super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                    ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                    super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,curr);
        bVar1 = writeAndTestReduction(this);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"|      tryToReplaceCurrent succeeded (in "
                                  );
          getLocation_abi_cxx11_(&local_48,this);
          poVar2 = std::operator<<(poVar2,(string *)&local_48);
          std::operator<<(poVar2,")\n");
          std::__cxx11::string::~string((string *)&local_48);
          noteReduction(this,1);
          this_local._7_1_ = true;
        }
        else {
          wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::replaceCurrent
                    (&(this->
                      super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                      ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                      super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,local_28
                    );
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool tryToReplaceCurrent(Expression* with) {
    if (!isOkReplacement(with)) {
      return false;
    }
    auto* curr = getCurrent();
    // std::cerr << "try " << curr << " => " << with << '\n';
    if (curr->type != with->type) {
      return false;
    }
    if (!shouldTryToReduce()) {
      return false;
    }
    replaceCurrent(with);
    if (!writeAndTestReduction()) {
      replaceCurrent(curr);
      return false;
    }
    std::cerr << "|      tryToReplaceCurrent succeeded (in " << getLocation()
              << ")\n";
    noteReduction();
    return true;
  }